

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void FT_Get_Transform(FT_Face face,FT_Matrix *matrix,FT_Vector *delta)

{
  FT_Face_Internal pFVar1;
  FT_Face_Internal internal;
  FT_Vector *delta_local;
  FT_Matrix *matrix_local;
  FT_Face face_local;
  
  if (face != (FT_Face)0x0) {
    pFVar1 = face->internal;
    if (matrix != (FT_Matrix *)0x0) {
      matrix->xx = (pFVar1->transform_matrix).xx;
      matrix->xy = (pFVar1->transform_matrix).xy;
      matrix->yx = (pFVar1->transform_matrix).yx;
      matrix->yy = (pFVar1->transform_matrix).yy;
    }
    if (delta != (FT_Vector *)0x0) {
      delta->x = (pFVar1->transform_delta).x;
      delta->y = (pFVar1->transform_delta).y;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Get_Transform( FT_Face     face,
                    FT_Matrix*  matrix,
                    FT_Vector*  delta )
  {
    FT_Face_Internal  internal;


    if ( !face )
      return;

    internal = face->internal;

    if ( matrix )
      *matrix = internal->transform_matrix;

    if ( delta )
      *delta = internal->transform_delta;
  }